

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O3

bool __thiscall
UnifiedRegex::TextbookBoyerMoore<char16_t>::Match<4u,4u>
          (TextbookBoyerMoore<char16_t> *this,Char *input,CharCount inputLength,
          CharCount *inputOffset,Char *pat,CharCount patLen,RegexStats *stats)

{
  code *pcVar1;
  bool bVar2;
  Char CVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  int iVar7;
  Type *pTVar8;
  uint uVar9;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *this_00;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Type local_bc;
  ulong uStack_b8;
  int lastOcc_1;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  undefined4 *local_88;
  int *local_80;
  uint local_78;
  uint local_74;
  TextbookBoyerMoore<char16_t> *local_70;
  uint *local_68;
  ulong local_60;
  ulong local_58;
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1> *local_50;
  int local_44;
  int iStack_40;
  int lastOcc;
  ulong local_38;
  
  local_70 = this;
  local_68 = inputOffset;
  if (input == (Char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xb9,"(input != 0)","input != 0");
    if (!bVar2) goto LAB_00f06841;
    *puVar6 = 0;
  }
  if (inputLength < *local_68) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xba,"(inputOffset <= inputLength)","inputOffset <= inputLength");
    if (!bVar2) {
LAB_00f06841:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  if (patLen <= inputLength) {
    uVar13 = *local_68;
    uVar11 = patLen - 1;
    if (uVar13 < inputLength - uVar11) {
      local_80 = (local_70->goodSuffix).ptr;
      local_50 = &local_70->lastOccurrence;
      local_38 = (ulong)(uVar11 * 4);
      uStack_b8 = (ulong)(uVar11 * 4 + 1);
      local_b0 = (ulong)(uVar11 * 4 + 2);
      local_a8 = (ulong)(uVar11 * 4 + 3);
      local_a0 = (ulong)uVar11;
      local_58 = (ulong)patLen;
      local_88 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_98 = (ulong)((int)local_58 - 2);
      local_90 = local_98 << 0x20;
      local_78 = (int)local_58 * 4 - 8;
      uVar9 = inputLength - uVar11;
      local_60 = (ulong)uVar11;
      do {
        _iStack_40 = (ulong)uVar13;
        iVar5 = (int)local_60;
        CVar3 = input[uVar13 + iVar5];
        this_00 = local_50;
        uVar14 = local_58;
        uVar15 = local_60;
        if (pat[local_38] != CVar3) {
          do {
            iVar5 = (int)uVar15;
            if (((pat[uStack_b8] == CVar3) || (pat[local_b0] == CVar3)) || (pat[local_a8] == CVar3))
            break;
            if ((ushort)CVar3 < 0x100) {
              BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                                (this_00,(uint)(ushort)CVar3);
              if (BVar4 == 0) {
                uVar13 = (int)_iStack_40 + (int)local_58;
                uVar14 = local_58;
                uVar15 = local_60;
              }
              else {
                local_44 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                                     (this_00,(uint)(ushort)CVar3);
                iVar5 = (int)_iStack_40;
                uVar14 = local_58;
LAB_00f066ae:
                uVar15 = local_60;
                iVar12 = (int)local_60;
                iVar7 = iVar12 - local_44;
                if (iVar7 < local_80[local_a0]) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  puVar6 = local_88;
                  *local_88 = 1;
                  bVar2 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                                     ,0xeb,
                                     "((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex])"
                                     ,
                                     "(int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]"
                                    );
                  if (!bVar2) goto LAB_00f06841;
                  *puVar6 = 0;
                  iVar7 = iVar12 - local_44;
                  iVar5 = (int)_iStack_40;
                  uVar14 = local_58;
                }
                uVar13 = iVar7 + iVar5;
                this_00 = local_50;
              }
            }
            else {
              bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                                (this_00,(uint)(ushort)CVar3,&local_44);
              iVar5 = (int)_iStack_40;
              if (bVar2) goto LAB_00f066ae;
              uVar13 = iVar5 + (int)uVar14;
              uVar15 = local_60;
              this_00 = local_50;
            }
            if (uVar9 <= uVar13) {
              return false;
            }
            _iStack_40 = (ulong)uVar13;
            iVar5 = (int)uVar15;
            CVar3 = input[uVar13 + iVar5];
          } while (pat[local_38] != CVar3);
        }
        lVar10 = local_90;
        uVar14 = local_98;
        uVar13 = local_78;
        if (iVar5 == 0) {
LAB_00f06827:
          *local_68 = (uint)_iStack_40;
          return true;
        }
        while( true ) {
          if (stats != (RegexStats *)0x0) {
            stats->numCompares = stats->numCompares + 1;
          }
          CVar3 = input[(uint)_iStack_40 + (int)uVar14];
          if (((pat[uVar13] != CVar3) && (pat[uVar13 + 1] != CVar3)) &&
             ((pat[uVar13 + 2] != CVar3 && (pat[uVar13 + 3] != CVar3)))) break;
          uVar14 = uVar14 - 1;
          lVar10 = lVar10 + -0x100000000;
          uVar13 = uVar13 - 4;
          if ((int)uVar14 < 0) goto LAB_00f06827;
        }
        uVar13 = (uint)(ushort)CVar3;
        local_74 = uVar9;
        if (uVar13 < 0x100) {
          BVar4 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::IsInDirectMap
                            (local_50,uVar13);
          if (BVar4 == 0) {
            iVar5 = (local_70->lastOccurrence).defv;
          }
          else {
            iVar5 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetDirectMap
                              (local_50,uVar13);
          }
        }
        else {
          bVar2 = CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)1>::GetNonDirect
                            (local_50,uVar13,&local_bc);
          pTVar8 = &(local_70->lastOccurrence).defv;
          if (bVar2) {
            pTVar8 = &local_bc;
          }
          iVar5 = *pTVar8;
        }
        iVar5 = (int)uVar14 - iVar5;
        iVar7 = *(int *)((long)local_80 + (lVar10 >> 0x1e));
        if (iVar5 <= iVar7) {
          iVar5 = iVar7;
        }
        uVar13 = iVar5 + iStack_40;
        uVar9 = local_74;
        if (local_74 <= uVar13) {
          return false;
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

bool TextbookBoyerMoore<C>::Match
        ( const Char *const input
        , const CharCount inputLength
        , CharCount& inputOffset
        , const Char* pat
        , const CharCount patLen
#if ENABLE_REGEX_CONFIG_OPTIONS
        , RegexStats* stats
#endif
        ) const
    {

        Assert(input != 0);
        Assert(inputOffset <= inputLength);

        if (inputLength < patLen)
            return false;

        CharCount offset = inputOffset;

        const CharCount endOffset = inputLength - (patLen - 1);
        const int32* const localGoodSuffix = goodSuffix;
        const LastOccMap* const localLastOccurrence = &lastOccurrence;

        const CharCount lastPatCharIndex = (patLen - 1);

        while (offset < endOffset)
        {
            // A separate tight loop to find the last character
            while (true)
            {
                uint inputChar = Chars<Char>::CTU(input[offset + lastPatCharIndex]);
                if (MatchPatternAt<equivClassSize, lastPatCharEquivClass>(inputChar, pat, lastPatCharIndex))
                {
                    // Found a match. Break out of this loop and go to the match pattern loop
                    break;
                }
                // Negative case is more common,
                // Write the checks so that we have a super tight loop
                int lastOcc;
                if (inputChar < localLastOccurrence->GetDirectMapSize())
                {
                    if (!localLastOccurrence->IsInDirectMap(inputChar))
                    {
                        offset += patLen;
                        if (offset >= endOffset)
                        {
                            return false;
                        }
                        continue;
                    }
                    lastOcc = localLastOccurrence->GetDirectMap(inputChar);
                }
                else if (!localLastOccurrence->GetNonDirect(inputChar, lastOcc))
                {
                    offset += patLen;
                    if (offset >= endOffset)
                    {
                        return false;
                    }
                    continue;
                }
                Assert((int)lastPatCharIndex - lastOcc >= localGoodSuffix[lastPatCharIndex]);
                offset += lastPatCharIndex - lastOcc;
                if (offset >= endOffset)
                {
                    return false;
                }
            }

            // CONSIDER: we can remove this check if we stop using TextbookBoyerMoore for one char pattern
            if (lastPatCharIndex == 0)
            {
                inputOffset = offset;
                return true;
            }

            // Match the rest of the pattern
            int32 j = lastPatCharIndex - 1;
            while (true)
            {
#if ENABLE_REGEX_CONFIG_OPTIONS
                if (stats != 0)
                    stats->numCompares++;
#endif
                uint inputChar = Chars<Char>::CTU(input[offset + j]);
                if (!MatchPatternAt<equivClassSize, equivClassSize>(inputChar, pat, j))
                {
                    const int32 e = j - localLastOccurrence->Get((Char)inputChar);
                    offset += e > localGoodSuffix[j] ? e : localGoodSuffix[j];
                    break;
                }
                if (--j < 0)
                {
                    inputOffset = offset;
                    return true;
                }
            }
        }
        return false;
    }